

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::IfGenerateSyntax::IfGenerateSyntax
          (IfGenerateSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token keyword,Token openParen,ExpressionSyntax *condition,Token closeParen,
          MemberSyntax *block,ElseClauseSyntax *elseClause)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  
  uVar6 = openParen._0_8_;
  uVar5 = keyword._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = IfGenerate;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->openParen).kind = (short)uVar6;
  (this->openParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->openParen).info = openParen.info;
  (this->condition).ptr = condition;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (this->block).ptr = block;
  this->elseClause = elseClause;
  (condition->super_SyntaxNode).parent = (SyntaxNode *)this;
  (block->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (elseClause != (ElseClauseSyntax *)0x0) {
    (elseClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

IfGenerateSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token openParen, ExpressionSyntax& condition, Token closeParen, MemberSyntax& block, ElseClauseSyntax* elseClause) :
        MemberSyntax(SyntaxKind::IfGenerate, attributes), keyword(keyword), openParen(openParen), condition(&condition), closeParen(closeParen), block(&block), elseClause(elseClause) {
        this->condition->parent = this;
        this->block->parent = this;
        if (this->elseClause) this->elseClause->parent = this;
    }